

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O1

Result __thiscall
tonk::SessionOutgoing::queueMessage
          (SessionOutgoing *this,uint queueIndex,MessageType messageType,uint8_t *data,size_t bytes)

{
  void *__dest;
  long lVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  long *plVar6;
  _func_int **pp_Var7;
  long *plVar8;
  ulong uVar9;
  Result *success;
  undefined4 in_register_00000034;
  ulong in_R9;
  int iVar10;
  uint uVar11;
  long *local_88;
  long local_78;
  long lStack_70;
  int local_64;
  pthread_mutex_t *local_60;
  char *local_58;
  uint local_50;
  char local_48 [16];
  void *local_38;
  
  if (in_R9 < 0x500) {
    local_64 = (int)data;
    local_60 = (pthread_mutex_t *)(CONCAT44(in_register_00000034,queueIndex) + 0x238);
    local_38 = (void *)bytes;
    iVar5 = pthread_mutex_lock(local_60);
    if (iVar5 != 0) {
      std::__throw_system_error(iVar5);
    }
    plVar6 = (long *)(CONCAT44(in_register_00000034,queueIndex) + 0x318 + (ulong)messageType * 0x28)
    ;
    iVar10 = (int)in_R9 + 2;
    iVar5 = 1;
    do {
      lVar1 = plVar6[1];
      if (lVar1 != 0) {
        uVar11 = *(uint *)(lVar1 + 8) + iVar10;
        if (uVar11 <= *(uint *)(*plVar6 + 0x1f0)) {
          __dest = (void *)(lVar1 + 0x12 + (ulong)*(uint *)(lVar1 + 8));
          *(ushort *)((long)__dest + -2) = (ushort)(local_64 << 0xb) | (ushort)in_R9;
          memcpy(__dest,local_38,in_R9);
          *(uint *)(lVar1 + 8) = uVar11;
          *(int *)(plVar6 + 4) = (int)plVar6[4] + iVar10;
          (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = (_func_int **)0x0;
          goto LAB_0012e091;
        }
      }
      OutgoingQueue::PushAndGetFreshBuffer((OutgoingQueue *)this);
      if ((this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing != (_func_int **)0x0)
      goto LAB_0012e091;
      Result::~Result((Result *)this);
      iVar5 = iVar5 + -1;
    } while (iVar5 == 0);
    cVar3 = '\x01';
    if (9 < in_R9) {
      uVar9 = in_R9;
      cVar4 = '\x04';
      do {
        cVar3 = cVar4;
        if (uVar9 < 100) {
          cVar3 = cVar3 + -2;
          goto LAB_0012dfa5;
        }
        if (uVar9 < 1000) {
          cVar3 = cVar3 + -1;
          goto LAB_0012dfa5;
        }
        if (uVar9 < 10000) goto LAB_0012dfa5;
        bVar2 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        cVar4 = cVar3 + '\x04';
      } while (bVar2);
      cVar3 = cVar3 + '\x01';
    }
LAB_0012dfa5:
    local_58 = local_48;
    std::__cxx11::string::_M_construct((ulong)&local_58,cVar3);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_58,local_50,in_R9);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_58);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_78 = *plVar8;
      lStack_70 = plVar6[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar8;
      local_88 = (long *)*plVar6;
    }
    lVar1 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    pp_Var7 = (_func_int **)operator_new(0x38);
    *pp_Var7 = (_func_int *)"SessionOutgoing::queueMessage";
    pp_Var7[1] = (_func_int *)(pp_Var7 + 3);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pp_Var7 + 1),local_88,lVar1 + (long)local_88);
    *(undefined4 *)(pp_Var7 + 5) = 0;
    pp_Var7[6] = (_func_int *)0x2;
    (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var7;
    if (local_88 != &local_78) {
      operator_delete(local_88);
    }
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
LAB_0012e091:
    pthread_mutex_unlock(local_60);
  }
  else {
    uVar9 = in_R9;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar9 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012de76;
      }
      if (uVar9 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012de76;
      }
      if (uVar9 < 10000) goto LAB_0012de76;
      bVar2 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
LAB_0012de76:
    local_58 = local_48;
    std::__cxx11::string::_M_construct((ulong)&local_58,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_58,local_50,in_R9);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_58);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_78 = *plVar8;
      lStack_70 = plVar6[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar8;
      local_88 = (long *)*plVar6;
    }
    lVar1 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    pp_Var7 = (_func_int **)operator_new(0x38);
    *pp_Var7 = (_func_int *)"SessionOutgoing::queueMessage";
    pp_Var7[1] = (_func_int *)(pp_Var7 + 3);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pp_Var7 + 1),local_88,lVar1 + (long)local_88);
    *(undefined4 *)(pp_Var7 + 5) = 0;
    pp_Var7[6] = (_func_int *)0x5;
    (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var7;
    if (local_88 != &local_78) {
      operator_delete(local_88);
    }
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionOutgoing::queueMessage(
    unsigned queueIndex,
    protocol::MessageType messageType,
    const uint8_t* data,
    size_t bytes)
{
    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    static_assert(TONK_MAX_UNORDERED_BYTES == TONK_MAX_UNRELIABLE_BYTES, "Update this");

    // This function only supports a few types of messages: Unreliable, Unordered, Control
    TONK_DEBUG_ASSERT(
        messageType < protocol::MessageType_StartOfReliables ||
        messageType >= protocol::MessageType_Control);

    // Message types must be in the proper queues
    TONK_DEBUG_ASSERT(
        (messageType < protocol::MessageType_StartOfReliables && queueIndex == Queue_Unreliable) ||
        (messageType == protocol::MessageType_Control && queueIndex == Queue_Unmetered) ||
        (messageType == protocol::MessageType_Unordered && queueIndex == Queue_Unmetered)
    );

    // Check for oversized messages without any additions up front to avoid
    // integer overflow issues
    if (bytes >= TONK_MAX_UNRELIABLE_BYTES)
    {
        return Result("SessionOutgoing::queueMessage",
            std::to_string(bytes) + " byte message too large",
            ErrorType::Tonk,
            Tonk_MessageTooLarge);
    }

    Locker locker(OutgoingQueueLock);

    TONK_DEBUG_ASSERT(TONK_MAX_UNRELIABLE_BYTES < MaxMessageSectionBytes);

    OutgoingQueue* queue = &Queues[queueIndex];

    // Try #1 : Append to existing buffer - Fails if too big or not created yet
    // Try #2 : Append to fresh buffer
    for (int tries = 0; tries < 2; ++tries)
    {
        // Attempt to append a message to the queue's workspace buffer
        if (queue->Append(messageType, data, static_cast<unsigned>(bytes))) {
            return Result::Success();
        }

        // Need more space- Push the workspace onto the queue and try again
        const Result result = queue->PushAndGetFreshBuffer();
        if (result.IsFail()) {
            return result;
        }
    }

    TONK_DEBUG_BREAK(); // Should never get here
    return Result("SessionOutgoing::queueMessage",
        std::to_string(bytes) + " byte message caused Append failure",
        ErrorType::Tonk,
        Tonk_Error);
}